

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable.cpp
# Opt level: O3

void __thiscall Variable::Variable(Variable *this,Kind kind,string *type,int value,int tag)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  uint __val;
  uint __len;
  string __str;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (this->arraySize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->arraySize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->arraySize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->kind = kind;
  __val = -tag;
  if (0 < tag) {
    __val = tag;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar5;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00128bc7;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00128bc7;
      }
      if (uVar3 < 10000) goto LAB_00128bc7;
      uVar5 = uVar5 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_00128bc7:
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)(tag >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)tag >> 0x1f) + (long)local_70[0]),__len,__val);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1397ef);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->name,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  this->visibility = PRIVATE;
  std::__cxx11::string::operator=((string *)&this->type,(string *)type);
  this->value = value;
  this->dimensions = 0;
  this->size = 0;
  this->offset = 0;
  return;
}

Assistant:

Variable::Variable(Enums::Kind kind, std::string type, int value, int tag) {
    this->kind = kind;
    this->name = "literal_" + std::to_string(tag);
    this->visibility = Enums::Visibility::PRIVATE;
    this->type = std::move(type);
    this->value = value;
    this->dimensions = 0;
    this->offset = 0;
    this->size = 0;
}